

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.c
# Opt level: O1

int scan_buffer(d_loc_t *aloc,D_State *parse_state,ShiftResult *results)

{
  char **ppcVar1;
  uchar uVar2;
  byte bVar3;
  short sVar4;
  void *pvVar5;
  void *pvVar6;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  SNode *pSVar10;
  D_Shift *pDVar11;
  char *pcVar12;
  undefined8 uVar13;
  long lVar14;
  ushort uVar15;
  ulong uVar16;
  ulong uVar17;
  D_Shift **ppDVar18;
  long *plVar19;
  undefined8 *puVar20;
  long *plVar21;
  ulong uVar22;
  int *piVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  D_Shift **ppDVar29;
  d_loc_t *pdVar30;
  char cVar31;
  ushort uVar32;
  uint uVar33;
  byte bVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  byte *pbVar38;
  bool bVar39;
  int local_9c;
  byte *local_98;
  int local_90;
  ulong local_80;
  char *local_58;
  char *pcStack_50;
  
  local_98 = (byte *)aloc->s;
  pcVar7 = aloc->pathname;
  pcVar9 = aloc->ws;
  local_9c = aloc->col;
  local_90 = aloc->line;
  local_58 = aloc->pathname;
  pcStack_50 = aloc->ws;
  uVar2 = parse_state->scanner_size;
  if (uVar2 == '\x04') {
    pvVar5 = parse_state->scanner_table;
    bVar3 = *local_98;
    uVar16 = (ulong)(bVar3 >> 6);
    uVar22 = (ulong)(bVar3 & 0x3f);
    iVar37 = *(int *)(*(long *)((long)pvVar5 + uVar16 * 8 + 8) + uVar22 * 4);
    if (iVar37 == 0) {
      uVar24 = 0;
      local_80 = 0;
    }
    else {
      pvVar6 = parse_state->transition_table;
      uVar17 = 0;
      uVar33 = 0;
      local_80 = 0;
      uVar24 = 0;
      pbVar38 = local_98;
      iVar25 = local_90;
      iVar35 = local_9c;
      iVar26 = local_9c;
      iVar36 = local_90;
      do {
        if (((uVar33 != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) &&
           (ppDVar29 = parse_state->accepts_diff
                       [*(uint *)(*(long *)((long)pvVar6 + uVar16 * 8 + uVar17 * 0x20) + uVar22 * 4)
                       ], *ppDVar29 != (D_Shift *)0x0)) {
          piVar23 = &results[(int)uVar24].loc.line;
          do {
            ppDVar18 = ppDVar29 + 1;
            ((d_loc_t *)(piVar23 + -7))->s = (char *)pbVar38;
            *(char **)(piVar23 + -5) = pcVar7;
            *(char **)(piVar23 + -3) = pcVar9;
            piVar23[-1] = iVar35;
            *piVar23 = iVar25;
            *(D_Shift **)(piVar23 + -9) = *ppDVar29;
            piVar23 = piVar23 + 0xc;
            uVar24 = uVar24 + 1;
            ppDVar29 = ppDVar18;
          } while (*ppDVar18 != (D_Shift *)0x0);
        }
        pbVar38 = pbVar38 + 1;
        uVar33 = iVar37 - 1;
        uVar17 = (ulong)uVar33;
        if (*(long *)((long)pvVar5 + uVar17 * 0x28) != 0) {
          local_80 = (ulong)uVar33;
          local_90 = iVar36;
          local_9c = iVar26;
          local_98 = pbVar38;
          local_58 = pcVar7;
          pcStack_50 = pcVar9;
        }
        iVar27 = iVar26 + 1;
        bVar39 = bVar3 == 10;
        if (bVar39) {
          iVar27 = 0;
        }
        bVar3 = *pbVar38;
        uVar16 = (ulong)(bVar3 >> 6);
        uVar22 = (ulong)(bVar3 & 0x3f);
        iVar37 = *(int *)(*(long *)((long)pvVar5 + uVar16 * 8 + uVar17 * 0x28 + 8) + uVar22 * 4);
        iVar25 = iVar36;
        iVar35 = iVar26;
        iVar26 = iVar27;
        iVar36 = (uint)bVar39 + iVar36;
      } while (iVar37 != 0);
    }
    puVar20 = (undefined8 *)((long)pvVar5 + local_80 * 0x28);
  }
  else if (uVar2 == '\x02') {
    pvVar5 = parse_state->scanner_table;
    bVar3 = *local_98;
    uVar16 = (ulong)(bVar3 >> 6);
    uVar22 = (ulong)(bVar3 & 0x3f);
    sVar4 = *(short *)(*(long *)((long)pvVar5 + uVar16 * 8 + 8) + uVar22 * 2);
    if (sVar4 == 0) {
      uVar24 = 0;
      uVar22 = 0;
    }
    else {
      pvVar6 = parse_state->transition_table;
      uVar17 = 0;
      uVar32 = 0;
      uVar15 = 0;
      uVar24 = 0;
      pbVar38 = local_98;
      iVar37 = local_90;
      iVar25 = local_9c;
      iVar35 = local_9c;
      iVar26 = local_90;
      do {
        if (((uVar32 != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) &&
           (ppDVar29 = parse_state->accepts_diff
                       [*(ushort *)
                         (*(long *)((long)pvVar6 + uVar16 * 8 + uVar17 * 0x20) + uVar22 * 2)],
           *ppDVar29 != (D_Shift *)0x0)) {
          piVar23 = &results[(int)uVar24].loc.line;
          do {
            ppDVar18 = ppDVar29 + 1;
            ((d_loc_t *)(piVar23 + -7))->s = (char *)pbVar38;
            *(char **)(piVar23 + -5) = pcVar7;
            *(char **)(piVar23 + -3) = pcVar9;
            piVar23[-1] = iVar25;
            *piVar23 = iVar37;
            *(D_Shift **)(piVar23 + -9) = *ppDVar29;
            piVar23 = piVar23 + 0xc;
            uVar24 = uVar24 + 1;
            ppDVar29 = ppDVar18;
          } while (*ppDVar18 != (D_Shift *)0x0);
        }
        pbVar38 = pbVar38 + 1;
        uVar32 = sVar4 - 1;
        uVar17 = (ulong)uVar32;
        if (*(long *)((long)pvVar5 + uVar17 * 0x28) != 0) {
          local_9c = iVar35;
          local_98 = pbVar38;
          local_58 = pcVar7;
          pcStack_50 = pcVar9;
          local_90 = iVar26;
          uVar15 = uVar32;
        }
        iVar36 = iVar35 + 1;
        bVar39 = bVar3 == 10;
        if (bVar39) {
          iVar36 = 0;
        }
        bVar3 = *pbVar38;
        uVar16 = (ulong)(bVar3 >> 6);
        uVar22 = (ulong)(bVar3 & 0x3f);
        sVar4 = *(short *)(*(long *)((long)pvVar5 + uVar16 * 8 + uVar17 * 0x28 + 8) + uVar22 * 2);
        iVar37 = iVar26;
        iVar25 = iVar35;
        iVar35 = iVar36;
        iVar26 = (uint)bVar39 + iVar26;
      } while (sVar4 != 0);
      uVar22 = (ulong)uVar15;
    }
    puVar20 = (undefined8 *)((long)pvVar5 + uVar22 * 0x28);
  }
  else {
    if (uVar2 != '\x01') {
      plVar19 = (long *)0x0;
      uVar24 = 0;
      goto LAB_0012c498;
    }
    pvVar5 = parse_state->scanner_table;
    bVar3 = *local_98;
    uVar33 = (uint)bVar3;
    uVar22 = (ulong)(bVar3 >> 6);
    uVar16 = (ulong)(bVar3 & 0x3f);
    cVar31 = *(char *)(*(long *)((long)pvVar5 + uVar22 * 8 + 8) + uVar16);
    if (cVar31 == '\0') {
      uVar22 = 0;
      uVar24 = 0;
    }
    else {
      pvVar6 = parse_state->transition_table;
      uVar17 = 0;
      uVar24 = 0;
      bVar34 = 0;
      bVar3 = 0;
      pbVar38 = local_98;
      iVar37 = local_9c;
      iVar25 = local_90;
      do {
        if (((bVar34 != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) &&
           (ppDVar29 = parse_state->accepts_diff
                       [*(byte *)(*(long *)((long)pvVar6 + uVar22 * 8 + uVar17 * 0x20) + uVar16)],
           *ppDVar29 != (D_Shift *)0x0)) {
          piVar23 = &results[(int)uVar24].loc.line;
          do {
            ppDVar18 = ppDVar29 + 1;
            ((d_loc_t *)(piVar23 + -7))->s = (char *)pbVar38;
            *(char **)(piVar23 + -5) = pcVar7;
            *(char **)(piVar23 + -3) = pcVar9;
            piVar23[-1] = iVar37;
            *piVar23 = iVar25;
            *(D_Shift **)(piVar23 + -9) = *ppDVar29;
            piVar23 = piVar23 + 0xc;
            uVar24 = uVar24 + 1;
            ppDVar29 = ppDVar18;
          } while (*ppDVar18 != (D_Shift *)0x0);
        }
        pbVar38 = pbVar38 + 1;
        bVar34 = cVar31 - 1;
        iVar37 = iVar37 + 1;
        bVar39 = (char)uVar33 == '\n';
        if (bVar39) {
          iVar37 = 0;
        }
        iVar25 = iVar25 + (uint)bVar39;
        uVar17 = (ulong)bVar34;
        if (*(long *)((long)pvVar5 + uVar17 * 0x28) != 0) {
          local_98 = pbVar38;
          local_9c = iVar37;
          local_58 = pcVar7;
          pcStack_50 = pcVar9;
          local_90 = iVar25;
          bVar3 = bVar34;
        }
        uVar33 = (uint)*pbVar38;
        uVar22 = (ulong)(*pbVar38 >> 6);
        uVar16 = (ulong)(uVar33 & 0x3f);
        cVar31 = *(char *)(*(long *)((long)pvVar5 + uVar22 * 8 + uVar17 * 0x28 + 8) + uVar16);
      } while (cVar31 != '\0');
      uVar22 = (ulong)bVar3;
    }
    puVar20 = (undefined8 *)((long)pvVar5 + uVar22 * 0x28);
  }
  plVar19 = (long *)*puVar20;
LAB_0012c498:
  if ((plVar19 != (long *)0x0) && (*plVar19 != 0)) {
    piVar23 = &results[(int)uVar24].loc.line;
    do {
      plVar21 = plVar19 + 1;
      ((d_loc_t *)(piVar23 + -7))->s = (char *)local_98;
      *(char **)(piVar23 + -5) = local_58;
      *(char **)(piVar23 + -3) = pcStack_50;
      piVar23[-1] = local_9c;
      *piVar23 = local_90;
      *(long *)(piVar23 + -9) = *plVar19;
      piVar23 = piVar23 + 0xc;
      uVar24 = uVar24 + 1;
      plVar19 = plVar21;
    } while (*plVar21 != 0);
  }
  if (uVar24 != 0) {
    pcVar7 = results[(int)(uVar24 - 1)].loc.s;
    uVar2 = parse_state->scan_kind;
    bVar39 = uVar2 == '\x01';
    uVar22 = 0;
    if (uVar2 == '\x02') {
      uVar33 = uVar24;
      if ((int)uVar24 < 1) {
        uVar22 = (ulong)(uVar24 - 1);
      }
      else {
        do {
          uVar22 = (ulong)(uVar33 - 1);
          if (results[uVar22].loc.s < pcVar7) goto LAB_0012c551;
          if ((results[uVar22].shift)->shift_kind == '\x01') {
            bVar39 = true;
          }
          uVar28 = uVar33 - 1;
          bVar8 = 0 < (int)uVar33;
          uVar33 = uVar28;
        } while (uVar28 != 0 && bVar8);
        uVar22 = 0xffffffff;
      }
    }
LAB_0012c551:
    uVar33 = (uint)uVar22;
    if (!bVar39) {
      if (uVar2 != '\x02') {
        return uVar24;
      }
      if (-1 < (int)uVar33) {
        ppDVar29 = &results[uVar22].shift;
        uVar16 = uVar22;
        do {
          if ((*ppDVar29)->shift_kind != '\x01') {
            iVar37 = (int)uVar22;
            if (uVar16 != uVar22) {
              pSVar10 = ((ShiftResult *)(ppDVar29 + -1))->snode;
              pDVar11 = *ppDVar29;
              pcVar7 = ((d_loc_t *)(ppDVar29 + 1))->s;
              pcVar9 = (char *)ppDVar29[2];
              lVar14 = (long)ppDVar29[4];
              ppcVar1 = &results[iVar37].loc.ws;
              *ppcVar1 = (char *)ppDVar29[3];
              ppcVar1[1] = (char *)lVar14;
              results[iVar37].loc.s = pcVar7;
              results[iVar37].loc.pathname = pcVar9;
              results[iVar37].snode = pSVar10;
              results[iVar37].shift = pDVar11;
            }
            uVar22 = (ulong)(iVar37 - 1);
          }
          uVar33 = (uint)uVar22;
          ppDVar29 = ppDVar29 + -6;
          bVar39 = 0 < (long)uVar16;
          uVar16 = uVar16 - 1;
        } while (bVar39);
      }
      iVar37 = uVar24 + ~uVar33;
      if (uVar33 == 0xffffffff) {
        return iVar37;
      }
      memmove(results,results + (long)(int)uVar33 + 1,(long)iVar37 * 0x30);
      return iVar37;
    }
    if (0 < (int)uVar24) {
      pdVar30 = &results->loc;
      uVar22 = 0;
      uVar33 = 0;
      do {
        if ((pdVar30->s == pcVar7) ||
           (*(char *)(*(long *)((long)(pdVar30 + -1) + 0x18) + 2) == '\x03')) {
          if (uVar22 != uVar33) {
            pSVar10 = *(SNode **)((long)(pdVar30 + -1) + 0x10);
            pDVar11 = *(D_Shift **)((long)(pdVar30 + -1) + 0x18);
            pcVar9 = pdVar30->s;
            pcVar12 = pdVar30->pathname;
            uVar13 = *(undefined8 *)&pdVar30->col;
            ppcVar1 = &results[(int)uVar33].loc.ws;
            *ppcVar1 = pdVar30->ws;
            ppcVar1[1] = (char *)uVar13;
            results[(int)uVar33].loc.s = pcVar9;
            results[(int)uVar33].loc.pathname = pcVar12;
            results[(int)uVar33].snode = pSVar10;
            results[(int)uVar33].shift = pDVar11;
          }
          uVar33 = uVar33 + 1;
        }
        uVar22 = uVar22 + 1;
        pdVar30 = (d_loc_t *)((long)(pdVar30 + 1) + 0x10);
      } while (uVar24 != uVar22);
      return uVar33;
    }
  }
  return 0;
}

Assistant:

int scan_buffer(d_loc_t *aloc, D_State *parse_state, ShiftResult *results) {
  d_loc_t loc = *aloc, last_loc = *aloc;
  char *s = loc.s;
  int col = loc.col, line = loc.line;
  int nresults = 0, i = 0, j;
  D_Shift **shift = NULL, **shift_diff = 0;

  switch (parse_state->scanner_size) {
    case 1: {
      /* all matches */
      SB_uint8 *st = (SB_uint8 *)parse_state->scanner_table;
      SB_trans_uint8 *tst = (SB_trans_uint8 *)parse_state->transition_table;
      uint8 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
    case 2: {
      /* all matches */
      SB_uint16 *st = (SB_uint16 *)parse_state->scanner_table;
      SB_trans_uint16 *tst = (SB_trans_uint16 *)parse_state->transition_table;
      uint16 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
    case 4: {
      /* all matches */
      SB_uint32 *st = (SB_uint32 *)parse_state->scanner_table;
      SB_trans_uint32 *tst = (SB_trans_uint32 *)parse_state->transition_table;
      uint32 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
  }
  if (shift) {
    for (; *shift; shift++) {
      results[nresults].loc = last_loc;
      results[nresults++].shift = *shift;
    }
  }
  if (nresults) {
    int longest = 0;
    char *end = results[nresults - 1].loc.s;
    if (parse_state->scan_kind == D_SCAN_LONGEST) longest = 1;
    if (parse_state->scan_kind == D_SCAN_MIXED) {
      for (i = nresults - 1; i >= 0; i--) {
        if (results[i].loc.s < end) break;
        if (results[i].shift->shift_kind == D_SCAN_LONGEST) longest = 1;
      }
    }
    if (longest) {
      /* keep only 'longest' */
      i = 0;
      for (j = 0; j < nresults; j++) {
        if (results[j].loc.s == end || results[j].shift->shift_kind == D_SCAN_TRAILING) {
          if (i != j) results[i] = results[j];
          i++;
        }
      }
      nresults = i;
    } else if (parse_state->scan_kind == D_SCAN_MIXED) {
      /* only keep non-longest */
      for (j = i; j >= 0; j--)
        if (results[j].shift->shift_kind != D_SCAN_LONGEST) {
          if (i != j) results[i] = results[j];
          i--;
        }
      nresults = nresults - i - 1;
      if (i != -1) memmove(&results[0], &results[i + 1], nresults * sizeof(results[0]));
    }
  }
  return nresults;
}